

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::str<kj::Quantity<long,kj::_::NanosecondLabel>>
          (String *__return_storage_ptr__,kj *this,Quantity<long,_kj::_::NanosecondLabel> *params)

{
  kj *this_00;
  Quantity<long,_kj::_::NanosecondLabel> *value;
  CappedArray<char,_32UL> *params_00;
  CappedArray<char,_32UL> local_40;
  kj *local_18;
  Quantity<long,_kj::_::NanosecondLabel> *params_local;
  
  local_18 = this;
  params_local = (Quantity<long,_kj::_::NanosecondLabel> *)__return_storage_ptr__;
  this_00 = (kj *)fwd<kj::Quantity<long,kj::_::NanosecondLabel>>
                            ((NoInfer<kj::Quantity<long,_kj::_::NanosecondLabel>_> *)this);
  toCharSequence<kj::Quantity<long,kj::_::NanosecondLabel>>(&local_40,this_00,value);
  _::concat<kj::CappedArray<char,32ul>>(__return_storage_ptr__,(_ *)&local_40,params_00);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}